

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib500.c
# Opt level: O0

int test(char *URL)

{
  int iVar1;
  double local_60;
  double time_total;
  double time_starttransfer;
  double time_pretransfer;
  double time_connect;
  double time_namelookup;
  FILE *moo;
  char *ipstr;
  CURL *curl;
  char *pcStack_18;
  CURLcode res;
  char *URL_local;
  
  moo = (FILE *)0x0;
  pcStack_18 = URL;
  iVar1 = curl_global_init(3);
  if (iVar1 != 0) {
    curl_mfprintf(_stderr,"curl_global_init() failed\n");
    return 0x7e;
  }
  ipstr = (char *)curl_easy_init();
  if (ipstr == (char *)0x0) {
    curl_mfprintf(_stderr,"curl_easy_init() failed\n");
    curl_global_cleanup();
    return 0x7e;
  }
  curl._4_4_ = curl_easy_setopt(ipstr,0x2712,pcStack_18);
  if ((curl._4_4_ == 0) && (curl._4_4_ = curl_easy_setopt(ipstr,0x2a,1), curl._4_4_ == 0)) {
    libtest_debug_config.nohex = 1;
    libtest_debug_config.tracetime = 1;
    curl._4_4_ = curl_easy_setopt(ipstr,0x276f,&libtest_debug_config);
    if ((curl._4_4_ == 0) &&
       ((curl._4_4_ = curl_easy_setopt(ipstr,0x4e7e,libtest_debug_cb), curl._4_4_ == 0 &&
        (curl._4_4_ = curl_easy_setopt(ipstr,0x29,1), curl._4_4_ == 0)))) {
      if ((libtest_arg3 != (char *)0x0) && (iVar1 = strcmp(libtest_arg3,"activeftp"), iVar1 == 0)) {
        curl._4_4_ = curl_easy_setopt(ipstr,0x2721,"-");
        if (curl._4_4_ != 0) goto LAB_001015a5;
        curl._4_4_ = 0;
      }
      curl._4_4_ = curl_easy_perform(ipstr);
      if (((curl._4_4_ == 0) &&
          (curl._4_4_ = curl_easy_getinfo(ipstr,0x100020,&moo), libtest_arg2 != (char *)0x0)) &&
         (time_namelookup = (double)fopen64(libtest_arg2,"wb"),
         (FILE *)time_namelookup != (FILE *)0x0)) {
        curl_mfprintf(time_namelookup,"IP: %s\n",moo);
        curl_easy_getinfo(ipstr,0x300004,&time_connect);
        curl_easy_getinfo(ipstr,0x300005,&time_pretransfer);
        curl_easy_getinfo(ipstr,0x300006,&time_starttransfer);
        curl_easy_getinfo(ipstr,0x300011,&time_total);
        curl_easy_getinfo(ipstr,0x300003,&local_60);
        if (time_pretransfer < time_connect) {
          curl_mfprintf(time_connect,time_pretransfer,time_namelookup,
                        "namelookup vs connect: %f %f\n");
        }
        if (time_starttransfer < time_pretransfer) {
          curl_mfprintf(time_pretransfer,time_starttransfer,time_namelookup,
                        "connect vs pretransfer: %f %f\n");
        }
        if (time_total < time_starttransfer) {
          curl_mfprintf(time_starttransfer,time_total,time_namelookup,
                        "pretransfer vs starttransfer: %f %f\n");
        }
        if (local_60 < time_total) {
          curl_mfprintf(time_total,local_60,time_namelookup,"starttransfer vs total: %f %f\n");
        }
        fclose((FILE *)time_namelookup);
      }
    }
  }
LAB_001015a5:
  curl_easy_cleanup(ipstr);
  curl_global_cleanup();
  return curl._4_4_;
}

Assistant:

int test(char *URL)
{
  CURLcode res;
  CURL *curl;
  char *ipstr=NULL;

  if(curl_global_init(CURL_GLOBAL_ALL) != CURLE_OK) {
    fprintf(stderr, "curl_global_init() failed\n");
    return TEST_ERR_MAJOR_BAD;
  }

  if((curl = curl_easy_init()) == NULL) {
    fprintf(stderr, "curl_easy_init() failed\n");
    curl_global_cleanup();
    return TEST_ERR_MAJOR_BAD;
  }

  test_setopt(curl, CURLOPT_URL, URL);
  test_setopt(curl, CURLOPT_HEADER, 1L);

  libtest_debug_config.nohex = 1;
  libtest_debug_config.tracetime = 1;
  test_setopt(curl, CURLOPT_DEBUGDATA, &libtest_debug_config);
  test_setopt(curl, CURLOPT_DEBUGFUNCTION, libtest_debug_cb);
  test_setopt(curl, CURLOPT_VERBOSE, 1L);

  if(libtest_arg3 && !strcmp(libtest_arg3, "activeftp"))
    test_setopt(curl, CURLOPT_FTPPORT, "-");

  setupcallbacks(curl);

  res = curl_easy_perform(curl);

  if(!res) {
    res = curl_easy_getinfo(curl, CURLINFO_PRIMARY_IP, &ipstr);
    if(libtest_arg2) {
      FILE *moo = fopen(libtest_arg2, "wb");
      if(moo) {
        double time_namelookup;
        double time_connect;
        double time_pretransfer;
        double time_starttransfer;
        double time_total;
        fprintf(moo, "IP: %s\n", ipstr);
        curl_easy_getinfo(curl, CURLINFO_NAMELOOKUP_TIME, &time_namelookup);
        curl_easy_getinfo(curl, CURLINFO_CONNECT_TIME, &time_connect);
        curl_easy_getinfo(curl, CURLINFO_PRETRANSFER_TIME, &time_pretransfer);
        curl_easy_getinfo(curl, CURLINFO_STARTTRANSFER_TIME,
                          &time_starttransfer);
        curl_easy_getinfo(curl, CURLINFO_TOTAL_TIME, &time_total);

        /* since the timing will always vary we only compare relative
           differences between these 5 times */
        if(time_namelookup > time_connect) {
          fprintf(moo, "namelookup vs connect: %f %f\n",
                  time_namelookup, time_connect);
        }
        if(time_connect > time_pretransfer) {
          fprintf(moo, "connect vs pretransfer: %f %f\n",
                  time_connect, time_pretransfer);
        }
        if(time_pretransfer > time_starttransfer) {
          fprintf(moo, "pretransfer vs starttransfer: %f %f\n",
                  time_pretransfer, time_starttransfer);
        }
        if(time_starttransfer > time_total) {
          fprintf(moo, "starttransfer vs total: %f %f\n",
                  time_starttransfer, time_total);
        }

        fclose(moo);
      }
    }
  }

test_cleanup:

  curl_easy_cleanup(curl);
  curl_global_cleanup();

  return (int)res;
}